

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

uint8_t av1_selectSamples(MV *mv,int *pts,int *pts_inref,int len,BLOCK_SIZE bsize)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  undefined7 in_register_00000081;
  ulong uVar5;
  int iVar6;
  
  uVar5 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar2 = block_size_high[uVar5];
  if (block_size_high[uVar5] < block_size_wide[uVar5]) {
    bVar2 = block_size_wide[uVar5];
  }
  bVar4 = 0x70;
  if (bVar2 < 0x70) {
    bVar4 = bVar2;
  }
  bVar2 = 0x10;
  if (0x10 < bVar4) {
    bVar2 = bVar4;
  }
  if (len < 1) {
    bVar4 = 0;
  }
  else {
    uVar5 = 0;
    bVar4 = 0;
    do {
      iVar6 = pts_inref[uVar5 * 2] - ((int)mv->col + pts[uVar5 * 2]);
      iVar1 = -iVar6;
      if (0 < iVar6) {
        iVar1 = iVar6;
      }
      iVar3 = pts_inref[uVar5 * 2 + 1] - ((int)mv->row + pts[uVar5 * 2 + 1]);
      iVar6 = -iVar3;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      if ((uint)(iVar6 + iVar1) <= (uint)bVar2) {
        if (uVar5 != bVar4) {
          *(undefined8 *)(pts + (ulong)bVar4 * 2) = *(undefined8 *)(pts + uVar5 * 2);
          *(undefined8 *)(pts_inref + (ulong)bVar4 * 2) = *(undefined8 *)(pts_inref + uVar5 * 2);
        }
        bVar4 = bVar4 + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  bVar2 = 1;
  if (1 < bVar4) {
    bVar2 = bVar4;
  }
  return bVar2;
}

Assistant:

uint8_t av1_selectSamples(MV *mv, int *pts, int *pts_inref, int len,
                          BLOCK_SIZE bsize) {
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int thresh = clamp(AOMMAX(bw, bh), 16, 112);
  uint8_t ret = 0;
  assert(len <= LEAST_SQUARES_SAMPLES_MAX);

  // Only keep the samples with MV differences within threshold.
  for (int i = 0; i < len; ++i) {
    const int diff = abs(pts_inref[2 * i] - pts[2 * i] - mv->col) +
                     abs(pts_inref[2 * i + 1] - pts[2 * i + 1] - mv->row);
    if (diff > thresh) continue;
    if (ret != i) {
      memcpy(pts + 2 * ret, pts + 2 * i, 2 * sizeof(pts[0]));
      memcpy(pts_inref + 2 * ret, pts_inref + 2 * i, 2 * sizeof(pts_inref[0]));
    }
    ++ret;
  }
  // Keep at least 1 sample.
  return AOMMAX(ret, 1);
}